

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_access(char *filename)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen64(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int fp_access (char *filename)
{
	/* test if a file exists */
	
	FILE *diskfile;
	
	diskfile = fopen(filename, "r");

	if (diskfile) {
		fclose(diskfile);
		return(0);
	} else {
	        return(-1);
	}
}